

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  uint __i;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *__ptr;
  size_t sStack_e0;
  int broadcastEnable;
  timeval tv;
  fd_set fds;
  
  signal(2,on_signal_close);
  signal(0xf,on_signal_close);
  init_globals();
  while( true ) {
    while( true ) {
      while( true ) {
        iVar2 = getopt(argc,argv,"p:l:m:");
        if (iVar2 != 0x6c) break;
        precent_lose = atoi(_optarg);
      }
      if (iVar2 != 0x6d) break;
      iVar2 = atoi(_optarg);
      my_port = (unsigned_short)iVar2;
    }
    if (iVar2 != 0x70) break;
    fwrite("CCCCCCCCCCCCCCCCCCCCCCCC\n",0x19,1,_stderr);
    flag_root = false;
    parse_parent_address(_optarg);
  }
  if (iVar2 == -1) {
    if (my_port != 0) {
      fwrite("AAAAAAAAAAAAAAAAAAAAAAAAA\n",0x1a,1,_stderr);
      socket_fd = socket(2,2,0);
      broadcastEnable = 1;
      setsockopt(socket_fd,1,6,&broadcastEnable,4);
      bzero(&my_addr,0x10);
      my_addr.sin_family = 2;
      my_addr.sin_port = my_port << 8 | my_port >> 8;
      my_addr.sin_addr.s_addr = 0;
      iVar2 = bind(socket_fd,(sockaddr *)&my_addr,0x10);
      if (-1 < iVar2) {
        do_express_myself();
        do {
          iVar2 = fileno(_stdin);
          for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
            fds.fds_bits[lVar5] = 0;
          }
          if (iVar2 <= socket_fd) {
            iVar2 = socket_fd;
          }
          fds.fds_bits[socket_fd / 0x40] =
               fds.fds_bits[socket_fd / 0x40] | 1L << ((byte)socket_fd & 0x3f);
          iVar3 = fileno(_stdin);
          iVar4 = fileno(_stdin);
          fds.fds_bits[iVar4 / 0x40] =
               fds.fds_bits[iVar4 / 0x40] | 1L << ((byte)(iVar3 % 0x40) & 0x3f);
          tv.tv_sec = 0;
          tv.tv_usec = 500000;
          iVar2 = select(iVar2 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
          if (-1 < iVar2) {
            lVar5 = std::chrono::_V2::system_clock::now();
            check_and_resend(lVar5 / 1000);
            iVar2 = fileno(_stdin);
            uVar1 = fds.fds_bits[iVar2 / 0x40];
            iVar2 = fileno(_stdin);
            if ((uVar1 >> ((long)iVar2 % 0x40 & 0x3fU) & 1) != 0) {
              read_message_from_console();
            }
            if (((ulong)fds.fds_bits[socket_fd / 0x40] >> ((long)socket_fd % 0x40 & 0x3fU) & 1) != 0
               ) {
              recv_message();
            }
          }
        } while( true );
      }
      perror("Bind");
      goto LAB_00103b3e;
    }
    __ptr = "No port\n";
    sStack_e0 = 8;
  }
  else {
    __ptr = "Unknown argument\n";
    sStack_e0 = 0x11;
  }
  fwrite(__ptr,sStack_e0,1,_stderr);
LAB_00103b3e:
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
    signal(SIGINT, on_signal_close);
    signal(SIGTERM, on_signal_close);

    init_globals();

    int opt = 0;
    while ((opt = getopt(argc, argv, "p:l:m:")) != -1) {
        switch (opt) {
            case 'p':
                fprintf(stderr, "CCCCCCCCCCCCCCCCCCCCCCCC\n");
                flag_root = false;
                parse_parent_address(optarg);
                break;
            case 'l':
                precent_lose = atoi(optarg);
                break;
            case 'm':
                my_port = (unsigned short)atoi(optarg);
                break;
            default:
                fprintf(stderr, "Unknown argument\n");
                exit(EXIT_FAILURE);
        }
    }
    if (!my_port) {
        fprintf(stderr, "No port\n");
        exit(EXIT_FAILURE);
    }
    fprintf(stderr, "AAAAAAAAAAAAAAAAAAAAAAAAA\n");

    socket_fd = socket(PF_INET, SOCK_DGRAM, 0);
    int broadcastEnable = 1;
    setsockopt(socket_fd, SOL_SOCKET, SO_BROADCAST, &broadcastEnable, sizeof(broadcastEnable));
    bzero(&my_addr, sizeof(struct sockaddr_in));
    my_addr.sin_family = PF_INET;
    my_addr.sin_port = htons(my_port);
    my_addr.sin_addr.s_addr = htonl(INADDR_ANY);
    if (bind(socket_fd, (struct sockaddr *)&my_addr, sizeof(struct sockaddr_in)) < 0) {
        perror("Bind");
        exit(EXIT_FAILURE);
    }

    do_express_myself();

    bool flag_main_cycle = true;
    while (flag_main_cycle) {
        fd_set fds;
        int max_fd = std::max(fileno(stdin), socket_fd);
        FD_ZERO(&fds);
        FD_SET(socket_fd, &fds);
        FD_SET(fileno(stdin), &fds);

        struct timeval tv = {0, SENDING_INTERVAL / 2};
        int activity = select(max_fd + 1, &fds, 0, 0, &tv);
        if (activity < 0) {
            continue;
        }
        /*if (activity) {
            fprintf(stderr, "Activity: %d\n", activity);
        }*/

        auto cur_time = std::chrono::high_resolution_clock::now().time_since_epoch();
        check_and_resend(std::chrono::duration_cast<std::chrono::microseconds>(cur_time).count());

        if (FD_ISSET(fileno(stdin), &fds)) {
            read_message_from_console();
        }

        if (FD_ISSET(socket_fd, &fds)) {
            //fprintf(stderr, "!!! On socket\n");
            recv_message();
        }
        //recv_message();
    }

    final_function();
    return 0;
}